

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

int ON::IsOpenNURBSFile(FILE *fp)

{
  int iVar1;
  bool bVar2;
  int version;
  ON_String sStartSectionComment;
  ON_BinaryFile archive;
  int local_244;
  ON_String local_240;
  ON_BinaryFile local_238;
  
  ON_String::ON_String(&local_240);
  local_244 = 0;
  if (fp != (FILE *)0x0) {
    ON_BinaryFile::ON_BinaryFile(&local_238,read3dm,fp);
    bVar2 = ON_BinaryArchive::Read3dmStartSection
                      (&local_238.super_ON_BinaryArchive,&local_244,&local_240);
    if (!bVar2) {
      local_244 = 0;
    }
    ON_BinaryFile::~ON_BinaryFile(&local_238);
  }
  iVar1 = local_244;
  ON_String::~ON_String(&local_240);
  return iVar1;
}

Assistant:

int ON::IsOpenNURBSFile( FILE* fp )
{
  ON_String sStartSectionComment;
  int version = 0;
  if ( 0 != fp )
  {
    ON_BinaryFile archive(ON::archive_mode::read3dm,fp);
    if ( !archive.Read3dmStartSection(&version,sStartSectionComment) )
      version = 0;
  }
  return version;
}